

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void http_sse_on_unsubscribe(void *sse_,void *args_)

{
  if (*(code **)((long)args_ + 0x20) != (code *)0x0) {
    (**(code **)((long)args_ + 0x20))(*(undefined8 *)((long)args_ + 0x28));
  }
  fio_free(args_);
  http_sse_try_free((http_sse_internal_s *)sse_);
  return;
}

Assistant:

static void http_sse_on_unsubscribe(void *sse_, void *args_) {
  http_sse_internal_s *sse = sse_;
  struct http_sse_subscribe_args *args = args_;
  if (args->on_unsubscribe)
    args->on_unsubscribe(args->udata);
  fio_free(args);
  http_sse_try_free(sse);
}